

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::hidePopup(QComboBox *this)

{
  QComboBoxPrivate *this_00;
  QObject *pQVar1;
  QAbstractItemView *this_01;
  Data *pDVar2;
  QItemSelectionRange *pQVar3;
  qsizetype qVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  QItemSelectionModel *pQVar8;
  QStyle *pQVar9;
  undefined4 *puVar10;
  Data *pDVar11;
  long in_FS_OFFSET;
  QObject *local_88;
  QArrayDataPointer<QItemSelectionRange> local_78;
  QItemSelectionModel *local_60;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x34c & 0x10) != 0) goto LAB_003b470d;
  this_00->field_0x34c = this_00->field_0x34c | 0x10;
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_00->container);
  if ((bVar5) &&
     (pQVar1 = (this_00->container).wp.value, (*(byte *)(*(long *)(pQVar1 + 0x20) + 9) & 0x80) != 0)
     ) {
    this_01 = *(QAbstractItemView **)(pQVar1 + 0x50);
    if (this_01 == (QAbstractItemView *)0x0) {
      pQVar8 = (QItemSelectionModel *)0x0;
    }
    else {
      pQVar8 = QAbstractItemView::selectionModel(this_01);
    }
    pQVar9 = QWidget::style(&this->super_QWidget);
    iVar7 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x51,0,this,0);
    if ((pQVar8 != (QItemSelectionModel *)0x0) && (iVar7 != 0)) {
      cVar6 = QItemSelectionModel::hasSelection();
      if (cVar6 != '\0') {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
        QItemSelectionModel::selection();
        qVar4 = local_58.size;
        pQVar3 = local_58.ptr;
        pDVar2 = (this_00->container).wp.d;
        if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
          local_88 = (QObject *)0x0;
        }
        else {
          local_88 = (this_00->container).wp.value;
        }
        local_78.d = local_58.d;
        local_78.ptr = local_58.ptr;
        local_78.size = local_58.size;
        if (local_58.d == (Data *)0x0) {
          pDVar11 = (Data *)0x0;
        }
        else {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pDVar11 = local_58.d;
        }
        local_60 = pQVar8;
        puVar10 = (undefined4 *)operator_new(0x38);
        *puVar10 = 1;
        *(code **)(puVar10 + 2) =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qcombobox.cpp:2921:45),_QtPrivate::List<>,_void>
             ::impl;
        *(QComboBoxPrivate **)(puVar10 + 4) = this_00;
        *(Data **)(puVar10 + 6) = pDVar11;
        *(QItemSelectionRange **)(puVar10 + 8) = pQVar3;
        *(qsizetype *)(puVar10 + 10) = qVar4;
        if (pDVar11 != (Data *)0x0) {
          LOCK();
          (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          pQVar8 = local_60;
        }
        *(QItemSelectionModel **)(puVar10 + 0xc) = pQVar8;
        QTimer::singleShotImpl(0,0,local_88,puVar10);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
        goto LAB_003b4706;
      }
    }
    QComboBoxPrivate::doHidePopup(this_00);
  }
LAB_003b4706:
  this_00->field_0x34c = this_00->field_0x34c & 0xef;
LAB_003b470d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::hidePopup()
{
    Q_D(QComboBox);
    if (d->hidingPopup)
        return;
    d->hidingPopup = true;
    // can't use QScopedValueRollback on a bitfield
    auto resetHidingPopup = qScopeGuard([d]{
        d->hidingPopup = false;
    });

    if (!d->container || !d->container->isVisible())
        return;

#if QT_CONFIG(effects)
    QItemSelectionModel *selectionModel = d->container->itemView()
                                        ? d->container->itemView()->selectionModel() : nullptr;
    // Flash selected/triggered item (if any) before hiding the popup.
    if (style()->styleHint(QStyle::SH_Menu_FlashTriggeredItem, nullptr, this) &&
        selectionModel && selectionModel->hasSelection()) {
        const QItemSelection selection = selectionModel->selection();

        QTimer::singleShot(0, d->container, [d, selection, selectionModel]{
            QSignalBlocker modelBlocker(d->model);
            QSignalBlocker viewBlocker(d->container->itemView());
            QSignalBlocker containerBlocker(d->container);

            // Deselect item and wait 60 ms.
            selectionModel->select(selection, QItemSelectionModel::Toggle);
            QTimer::singleShot(60, d->container, [d, selection, selectionModel]{
                QSignalBlocker modelBlocker(d->model);
                QSignalBlocker viewBlocker(d->container->itemView());
                QSignalBlocker containerBlocker(d->container);
                selectionModel->select(selection, QItemSelectionModel::Toggle);
                QTimer::singleShot(20, d->container, [d] {
                    d->doHidePopup();
                });
            });
        });
    } else
#endif // QT_CONFIG(effects)
    {
        d->doHidePopup();
    }
}